

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_enum_decl(gvisitor_t *self,gnode_enum_decl_t *node)

{
  long *plVar1;
  _Bool _Var2;
  symboltable_t *table;
  gnode_t *node_00;
  
  plVar1 = *self->data;
  if ((plVar1 == (long *)0x0) || (*plVar1 == 0)) {
    node_00 = (gnode_t *)0x0;
  }
  else {
    node_00 = *(gnode_t **)(plVar1[2] + -8 + *plVar1 * 8);
  }
  check_access_storage_specifiers(self,&node->base,node_00->tag,node->access,node->storage);
  if (node_00->tag == NODE_FUNCTION_DECL) {
    table = symtable_from_node(node_00);
    _Var2 = symboltable_insert(table,node->identifier,&node->base);
    if (!_Var2) {
      report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,"Identifier %s redeclared.",
                   node->identifier);
      return;
    }
  }
  return;
}

Assistant:

static void visit_enum_decl (gvisitor_t *self, gnode_enum_decl_t *node) {
    #pragma unused(self,node)
    DEBUG_CODEGEN("visit_enum_decl %s", node->identifier);

    // enum is a map at runtime
    // enum foo {a=1,b=2,...}
    // is translated to
    // var foo = [a:1,b:2,...]
}